

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decodeSeqHeaders(ZSTD_DCtx *dctx,int *nbSeqPtr,void *src,size_t srcSize)

{
  U16 UVar1;
  uint uVar2;
  byte *pbVar3;
  size_t code;
  size_t code_00;
  size_t code_01;
  long in_RCX;
  byte *pbVar4;
  byte *in_RDX;
  undefined8 unaff_RBX;
  uint *in_RSI;
  undefined8 unaff_R14;
  ZSTD_seqSymbol **unaff_retaddr;
  ZSTD_seqSymbol *in_stack_00000008;
  size_t in_stack_00000020;
  U32 *in_stack_00000028;
  size_t mlhSize;
  size_t ofhSize;
  size_t llhSize;
  symbolEncodingType_e MLtype;
  symbolEncodingType_e OFtype;
  symbolEncodingType_e LLtype;
  int nbSeq;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  void *in_stack_ffffffffffffff58;
  uint local_54;
  byte *local_50;
  void *in_stack_ffffffffffffffe8;
  U32 maxLog;
  
  maxLog = (U32)((ulong)unaff_RBX >> 0x20);
  pbVar3 = in_RDX + in_RCX;
  if (in_RCX == 0) {
    local_50 = (byte *)0xffffffffffffffb8;
  }
  else {
    pbVar4 = in_RDX + 1;
    local_54 = (uint)*in_RDX;
    if (local_54 == 0) {
      *in_RSI = 0;
      local_50 = (byte *)0x1;
    }
    else {
      local_50 = pbVar4;
      if (0x7f < local_54) {
        if (local_54 == 0xff) {
          if (pbVar3 < in_RDX + 3) {
            return 0xffffffffffffffb8;
          }
          UVar1 = MEM_readLE16(in_stack_ffffffffffffff58);
          local_54 = UVar1 + 0x7f00;
          local_50 = in_RDX + 3;
        }
        else {
          if (pbVar3 <= pbVar4) {
            return 0xffffffffffffffb8;
          }
          local_50 = in_RDX + 2;
          local_54 = (local_54 - 0x80) * 0x100 + (uint)*pbVar4;
        }
      }
      *in_RSI = local_54;
      if (pbVar3 < local_50 + 4) {
        local_50 = (byte *)0xffffffffffffffb8;
      }
      else {
        code = ZSTD_buildSeqTable(in_stack_00000008,unaff_retaddr,
                                  (symbolEncodingType_e)((ulong)unaff_R14 >> 0x20),(U32)unaff_R14,
                                  maxLog,in_stack_ffffffffffffffe8,in_stack_00000020,
                                  in_stack_00000028,(U32 *)mlhSize,(ZSTD_seqSymbol *)ofhSize,
                                  (U32)llhSize);
        uVar2 = ERR_isError(code);
        if (uVar2 == 0) {
          code_00 = ZSTD_buildSeqTable(in_stack_00000008,unaff_retaddr,
                                       (symbolEncodingType_e)((ulong)unaff_R14 >> 0x20),
                                       (U32)unaff_R14,maxLog,in_stack_ffffffffffffffe8,
                                       in_stack_00000020,in_stack_00000028,(U32 *)mlhSize,
                                       (ZSTD_seqSymbol *)ofhSize,(U32)llhSize);
          uVar2 = ERR_isError(code_00);
          if (uVar2 == 0) {
            code_01 = ZSTD_buildSeqTable(in_stack_00000008,unaff_retaddr,
                                         (symbolEncodingType_e)((ulong)unaff_R14 >> 0x20),
                                         (U32)unaff_R14,maxLog,in_stack_ffffffffffffffe8,
                                         in_stack_00000020,in_stack_00000028,(U32 *)mlhSize,
                                         (ZSTD_seqSymbol *)ofhSize,(U32)llhSize);
            uVar2 = ERR_isError(code_01);
            if (uVar2 == 0) {
              local_50 = local_50 + ((code_01 + code_00 + code + 1) - (long)in_RDX);
            }
            else {
              local_50 = (byte *)0xffffffffffffffec;
            }
          }
          else {
            local_50 = (byte *)0xffffffffffffffec;
          }
        }
        else {
          local_50 = (byte *)0xffffffffffffffec;
        }
      }
    }
  }
  return (size_t)local_50;
}

Assistant:

size_t ZSTD_decodeSeqHeaders(ZSTD_DCtx* dctx, int* nbSeqPtr,
                             const void* src, size_t srcSize)
{
    const BYTE* const istart = (const BYTE* const)src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip = istart;
    DEBUGLOG(5, "ZSTD_decodeSeqHeaders");

    /* check */
    if (srcSize < MIN_SEQUENCES_SIZE) return ERROR(srcSize_wrong);

    /* SeqHead */
    {   int nbSeq = *ip++;
        if (!nbSeq) { *nbSeqPtr=0; return 1; }
        if (nbSeq > 0x7F) {
            if (nbSeq == 0xFF) {
                if (ip+2 > iend) return ERROR(srcSize_wrong);
                nbSeq = MEM_readLE16(ip) + LONGNBSEQ, ip+=2;
            } else {
                if (ip >= iend) return ERROR(srcSize_wrong);
                nbSeq = ((nbSeq-0x80)<<8) + *ip++;
            }
        }
        *nbSeqPtr = nbSeq;
    }

    /* FSE table descriptors */
    if (ip+4 > iend) return ERROR(srcSize_wrong); /* minimum possible size */
    {   symbolEncodingType_e const LLtype = (symbolEncodingType_e)(*ip >> 6);
        symbolEncodingType_e const OFtype = (symbolEncodingType_e)((*ip >> 4) & 3);
        symbolEncodingType_e const MLtype = (symbolEncodingType_e)((*ip >> 2) & 3);
        ip++;

        /* Build DTables */
        {   size_t const llhSize = ZSTD_buildSeqTable(dctx->entropy.LLTable, &dctx->LLTptr,
                                                      LLtype, MaxLL, LLFSELog,
                                                      ip, iend-ip,
                                                      LL_base, LL_bits,
                                                      LL_defaultDTable, dctx->fseEntropy);
            if (ZSTD_isError(llhSize)) return ERROR(corruption_detected);
            ip += llhSize;
        }

        {   size_t const ofhSize = ZSTD_buildSeqTable(dctx->entropy.OFTable, &dctx->OFTptr,
                                                      OFtype, MaxOff, OffFSELog,
                                                      ip, iend-ip,
                                                      OF_base, OF_bits,
                                                      OF_defaultDTable, dctx->fseEntropy);
            if (ZSTD_isError(ofhSize)) return ERROR(corruption_detected);
            ip += ofhSize;
        }

        {   size_t const mlhSize = ZSTD_buildSeqTable(dctx->entropy.MLTable, &dctx->MLTptr,
                                                      MLtype, MaxML, MLFSELog,
                                                      ip, iend-ip,
                                                      ML_base, ML_bits,
                                                      ML_defaultDTable, dctx->fseEntropy);
            if (ZSTD_isError(mlhSize)) return ERROR(corruption_detected);
            ip += mlhSize;
        }
    }

    return ip-istart;
}